

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrCompositionLayerBaseHeader *value)

{
  XrStructureType type;
  pointer pbVar1;
  XrResult XVar2;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  string error_str;
  string local_e0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  type = value->type;
  if ((int)type < 0x3b9b1050) {
    if ((int)type < 0x3b9ae170) {
      if (type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerProjection *)value);
        return XVar2;
      }
      if (type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerQuad *)value);
        return XVar2;
      }
    }
    else {
      if (type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
        if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
          pbVar4 = (instance_info->enabled_extensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (instance_info->enabled_extensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar5 = pbVar4 != pbVar1;
          if (bVar5) {
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
            while (iVar3 != 0) {
              pbVar4 = pbVar4 + 1;
              bVar5 = pbVar4 != pbVar1;
              if (pbVar4 == pbVar1) break;
              iVar3 = std::__cxx11::string::compare((char *)pbVar4);
            }
          }
          if (!bVar5) {
            error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_str,
                       "XrCompositionLayerBaseHeader being used with child struct type ","");
            std::__cxx11::string::append((char *)&error_str);
            std::__cxx11::string::append((char *)&error_str);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"VUID-XrCompositionLayerBaseHeader-type-type","");
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_48,objects_info);
            CoreValidLogMessage(instance_info,&local_e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_48,&error_str);
            local_a8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_48.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_a8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_48.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
joined_r0x00163edb:
            if (local_a8.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error_str._M_dataplus._M_p != &error_str.field_2) {
              operator_delete(error_str._M_dataplus._M_p,error_str.field_2._M_allocated_capacity + 1
                             );
            }
            return XR_ERROR_VALIDATION_FAILURE;
          }
        }
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerCubeKHR *)value);
        return XVar2;
      }
      if (type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
        if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
          pbVar4 = (instance_info->enabled_extensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (instance_info->enabled_extensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar5 = pbVar4 != pbVar1;
          if (bVar5) {
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
            while (iVar3 != 0) {
              pbVar4 = pbVar4 + 1;
              bVar5 = pbVar4 != pbVar1;
              if (pbVar4 == pbVar1) break;
              iVar3 = std::__cxx11::string::compare((char *)pbVar4);
            }
          }
          if (!bVar5) {
            error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_str,
                       "XrCompositionLayerBaseHeader being used with child struct type ","");
            std::__cxx11::string::append((char *)&error_str);
            std::__cxx11::string::append((char *)&error_str);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"VUID-XrCompositionLayerBaseHeader-type-type","");
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_60,objects_info);
            CoreValidLogMessage(instance_info,&local_e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_60,&error_str);
            local_a8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_60.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_a8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_60.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            goto joined_r0x00163edb;
          }
        }
        XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                                 (XrCompositionLayerCylinderKHR *)value);
        return XVar2;
      }
    }
  }
  else if ((int)type < 0x3b9c96f3) {
    if (type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
      if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
        pbVar4 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = pbVar4 != pbVar1;
        if (bVar5) {
          iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          while (iVar3 != 0) {
            pbVar4 = pbVar4 + 1;
            bVar5 = pbVar4 != pbVar1;
            if (pbVar4 == pbVar1) break;
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          }
        }
        if (!bVar5) {
          error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_str,
                     "XrCompositionLayerBaseHeader being used with child struct type ","");
          std::__cxx11::string::append((char *)&error_str);
          std::__cxx11::string::append((char *)&error_str);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"VUID-XrCompositionLayerBaseHeader-type-type","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_78,objects_info);
          CoreValidLogMessage(instance_info,&local_e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_78,&error_str);
          local_a8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_78.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_a8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_78.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          goto joined_r0x00163edb;
        }
      }
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrCompositionLayerEquirectKHR *)value);
      return XVar2;
    }
    if (type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
      if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
        pbVar4 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = pbVar4 != pbVar1;
        if (bVar5) {
          iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          while (iVar3 != 0) {
            pbVar4 = pbVar4 + 1;
            bVar5 = pbVar4 != pbVar1;
            if (pbVar4 == pbVar1) break;
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          }
        }
        if (!bVar5) {
          error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_str,
                     "XrCompositionLayerBaseHeader being used with child struct type ","");
          std::__cxx11::string::append((char *)&error_str);
          std::__cxx11::string::append((char *)&error_str);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"VUID-XrCompositionLayerBaseHeader-type-type","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_90,objects_info);
          CoreValidLogMessage(instance_info,&local_e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_90,&error_str);
          local_a8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_90.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_a8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_90.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          goto joined_r0x00163edb;
        }
      }
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrCompositionLayerEquirect2KHR *)value);
      return XVar2;
    }
  }
  else {
    if (type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
      if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
        pbVar4 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = pbVar4 != pbVar1;
        if (bVar5) {
          iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          while (iVar3 != 0) {
            pbVar4 = pbVar4 + 1;
            bVar5 = pbVar4 != pbVar1;
            if (pbVar4 == pbVar1) break;
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          }
        }
        if (!bVar5) {
          error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_str,
                     "XrCompositionLayerBaseHeader being used with child struct type ","");
          std::__cxx11::string::append((char *)&error_str);
          std::__cxx11::string::append((char *)&error_str);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"VUID-XrCompositionLayerBaseHeader-type-type","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_a8,objects_info);
          CoreValidLogMessage(instance_info,&local_e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_a8,&error_str);
          goto joined_r0x00163edb;
        }
      }
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrCompositionLayerPassthroughFB *)value);
      return XVar2;
    }
    if (type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
      if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
        pbVar4 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (instance_info->enabled_extensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = pbVar4 != pbVar1;
        if (bVar5) {
          iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          while (iVar3 != 0) {
            pbVar4 = pbVar4 + 1;
            bVar5 = pbVar4 != pbVar1;
            if (pbVar4 == pbVar1) break;
            iVar3 = std::__cxx11::string::compare((char *)pbVar4);
          }
        }
        if (!bVar5) {
          error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_str,
                     "XrCompositionLayerBaseHeader being used with child struct type ","");
          std::__cxx11::string::append((char *)&error_str);
          std::__cxx11::string::append((char *)&error_str);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"VUID-XrCompositionLayerBaseHeader-type-type","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_c0,objects_info);
          CoreValidLogMessage(instance_info,&local_e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_c0,&error_str);
          local_a8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_c0.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_a8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_c0.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          goto joined_r0x00163edb;
        }
      }
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrCompositionLayerPassthroughHTC *)value);
      return XVar2;
    }
  }
  InvalidStructureType
            (instance_info,command_name,objects_info,"XrCompositionLayerBaseHeader",type,
             "VUID-XrCompositionLayerBaseHeader-type-type",XR_TYPE_UNKNOWN,"");
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrCompositionLayerBaseHeader* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-next-next" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-layerFlags-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-space-parameter" because it is a base structure
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
        const XrCompositionLayerProjection* new_value = reinterpret_cast<const XrCompositionLayerProjection*>(value);
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
        const XrCompositionLayerQuad* new_value = reinterpret_cast<const XrCompositionLayerQuad*>(value);
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
        const XrCompositionLayerCubeKHR* new_value = reinterpret_cast<const XrCompositionLayerCubeKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_cube")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_CUBE_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_cube\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
        const XrCompositionLayerCylinderKHR* new_value = reinterpret_cast<const XrCompositionLayerCylinderKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_cylinder")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_cylinder\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
        const XrCompositionLayerEquirectKHR* new_value = reinterpret_cast<const XrCompositionLayerEquirectKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_equirect")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_equirect\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
        const XrCompositionLayerEquirect2KHR* new_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_equirect2")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_equirect2\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
        const XrCompositionLayerPassthroughFB* new_value = reinterpret_cast<const XrCompositionLayerPassthroughFB*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_passthrough")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB\"";
            error_str += " which requires extension \"XR_FB_passthrough\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
        const XrCompositionLayerPassthroughHTC* new_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_HTC_passthrough")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC\"";
            error_str += " which requires extension \"XR_HTC_passthrough\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrCompositionLayerBaseHeader",
                         value->type, "VUID-XrCompositionLayerBaseHeader-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}